

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalVector.hpp
# Opt level: O3

void __thiscall
limonp::LocalVector<unsigned_int>::reserve(LocalVector<unsigned_int> *this,size_t size)

{
  ulong uVar1;
  LocalVector<unsigned_int> *__src;
  uint *__dest;
  
  uVar1 = this->capacity_;
  if (uVar1 < size) {
    __dest = (uint *)malloc(size * 4);
    if (__dest == (uint *)0x0) {
      __assert_fail("next",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/deps/limonp/LocalVector.hpp"
                    ,0x5c,
                    "void limonp::LocalVector<unsigned int>::reserve(size_t) [T = unsigned int]");
    }
    __src = (LocalVector<unsigned_int> *)this->ptr_;
    this->ptr_ = __dest;
    memcpy(__dest,__src,uVar1 << 2);
    this->capacity_ = size;
    if (__src != this) {
      free(__src);
      return;
    }
  }
  return;
}

Assistant:

void reserve(size_t size) {
    if(size <= capacity_) {
      return;
    }
    T * next =  (T*)malloc(sizeof(T) * size);
    assert(next);
    T * old = ptr_;
    ptr_ = next;
    memcpy(ptr_, old, sizeof(T) * capacity_);
    capacity_ = size;
    if(old != buffer_) {
      free(old);
    }
  }